

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O2

size_t __thiscall sentencepiece::NormalizerSpec::ByteSizeLong(NormalizerSpec *this)

{
  uint uVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar3 = google::protobuf::internal::ExtensionSet::ByteSize(&this->_extensions_);
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0x3f) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize
                        ((string *)((ulong)(this->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      sVar3 = sVar3 + sVar4 + 1;
    }
    if ((uVar1 & 2) != 0) {
      sVar4 = google::protobuf::internal::WireFormatLite::BytesSize
                        ((string *)
                         ((ulong)(this->precompiled_charsmap_).tagged_ptr_.ptr_ & 0xfffffffffffffffe
                         ));
      sVar3 = sVar3 + sVar4 + 1;
    }
    if ((uVar1 & 4) != 0) {
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->normalization_rule_tsv_).tagged_ptr_.ptr_ &
                         0xfffffffffffffffe));
      sVar3 = sVar3 + sVar4 + 1;
    }
    sVar3 = sVar3 + ((uVar1 >> 4 & 2) + (uVar1 >> 3 & 2) + (uVar1 >> 2 & 2));
  }
  pvVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    sVar3 = sVar3 + *(long *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict1)sVar3;
  return sVar3;
}

Assistant:

size_t NormalizerSpec::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:sentencepiece.NormalizerSpec)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x0000003fu) {
    // optional string name = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_name());
    }

    // optional bytes precompiled_charsmap = 2;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::BytesSize(
          this->_internal_precompiled_charsmap());
    }

    // optional string normalization_rule_tsv = 6;
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_normalization_rule_tsv());
    }

    // optional bool add_dummy_prefix = 3 [default = true];
    if (cached_has_bits & 0x00000008u) {
      total_size += 1 + 1;
    }

    // optional bool remove_extra_whitespaces = 4 [default = true];
    if (cached_has_bits & 0x00000010u) {
      total_size += 1 + 1;
    }

    // optional bool escape_whitespaces = 5 [default = true];
    if (cached_has_bits & 0x00000020u) {
      total_size += 1 + 1;
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}